

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uts.c
# Opt level: O3

int uts_numChildren_bin(Node *parent)

{
  uint uVar1;
  int iVar2;
  double dVar3;
  
  uVar1 = rng_rand((parent->state).state);
  if ((int)uVar1 < 0) {
    printf("*** toProb: rand n = %d out of range\n",(ulong)uVar1);
  }
  dVar3 = 0.0;
  if (-1 < (int)uVar1) {
    dVar3 = (double)(int)uVar1 * 4.656612873077393e-10;
  }
  iVar2 = 0;
  if (dVar3 < nonLeafProb) {
    iVar2 = nonLeafBF;
  }
  return iVar2;
}

Assistant:

int uts_numChildren_bin(Node * parent) {
  // distribution is identical everywhere below root
  int    v = rng_rand(parent->state.state);	
  double d = rng_toProb(v);

  return (d < nonLeafProb) ? nonLeafBF : 0;
}